

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int exprNodeIsConstantOrGroupBy(Walker *pWalker,Expr *pExpr)

{
  ExprList *pEVar1;
  Expr *pB;
  uint uVar2;
  int iVar3;
  CollSeq *p;
  ExprList_item *pEVar4;
  long lVar5;
  
  pEVar1 = (pWalker->u).pGroupBy;
  pEVar4 = pEVar1->a;
  lVar5 = 0;
  do {
    if (pEVar1->nExpr <= lVar5) {
      if ((pExpr->flags & 0x800) != 0) {
        pWalker->eCode = '\0';
        return 2;
      }
      iVar3 = exprNodeIsConstant(pWalker,pExpr);
      return iVar3;
    }
    pB = pEVar4->pExpr;
    uVar2 = sqlite3ExprCompare((Parse *)0x0,pExpr,pB,-1);
    if (uVar2 < 2) {
      p = sqlite3ExprNNCollSeq(pWalker->pParse,pB);
      iVar3 = sqlite3IsBinary(p);
      if (iVar3 != 0) {
        return 1;
      }
    }
    lVar5 = lVar5 + 1;
    pEVar4 = pEVar4 + 1;
  } while( true );
}

Assistant:

static int exprNodeIsConstantOrGroupBy(Walker *pWalker, Expr *pExpr){
  ExprList *pGroupBy = pWalker->u.pGroupBy;
  int i;

  /* Check if pExpr is identical to any GROUP BY term. If so, consider
  ** it constant.  */
  for(i=0; i<pGroupBy->nExpr; i++){
    Expr *p = pGroupBy->a[i].pExpr;
    if( sqlite3ExprCompare(0, pExpr, p, -1)<2 ){
      CollSeq *pColl = sqlite3ExprNNCollSeq(pWalker->pParse, p);
      if( sqlite3IsBinary(pColl) ){
        return WRC_Prune;
      }
    }
  }

  /* Check if pExpr is a sub-select. If so, consider it variable. */
  if( ExprHasProperty(pExpr, EP_xIsSelect) ){
    pWalker->eCode = 0;
    return WRC_Abort;
  }

  return exprNodeIsConstant(pWalker, pExpr);
}